

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

int Sfm_TimTrace(Sfm_Tim_t *p)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  int **pTimesIn;
  int *piVar3;
  int *in_RCX;
  long lVar4;
  int iVar5;
  int iVar6;
  
  p_00 = Abc_NtkDfs(p->pNtk,1);
  iVar5 = 0;
  while( true ) {
    if (p_00->nSize <= iVar5) {
      iVar5 = 0;
      for (iVar6 = 0; pNtk = p->pNtk, iVar6 < pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = Abc_NtkCo(pNtk,iVar6);
        iVar1 = Sfm_TimArrMax(p,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray])
        ;
        if (iVar5 <= iVar1) {
          iVar5 = iVar1;
        }
      }
      Vec_IntFill(&p->vTimReqs,pNtk->vObjs->nSize * 2,1000000000);
      for (iVar6 = 0; iVar6 < p->pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = Abc_NtkCo(p->pNtk,iVar6);
        piVar3 = Sfm_TimReq(p,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
        piVar3[1] = iVar5;
        *piVar3 = iVar5;
      }
      iVar6 = p_00->nSize;
      while (0 < iVar6) {
        iVar6 = iVar6 + -1;
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar6);
        Sfm_TimNodeRequired(p,pAVar2);
      }
      free(p_00->pArray);
      free(p_00);
      return iVar5;
    }
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar5);
    pTimesIn = (int **)Sfm_TimArr(p,pAVar2);
    iVar6 = (pAVar2->vFanins).nSize;
    if (6 < iVar6) break;
    for (lVar4 = 0; lVar4 < iVar6; lVar4 = lVar4 + 1) {
      piVar3 = Sfm_TimArrId(p,(pAVar2->vFanins).pArray[lVar4]);
      *(int **)(&stack0xffffffffffffff98 + lVar4 * 8) = piVar3;
      iVar6 = (pAVar2->vFanins).nSize;
    }
    Sfm_TimGateArrival((Sfm_Tim_t *)(pAVar2->field_5).pData,(Mio_Gate_t *)&stack0xffffffffffffff98,
                       pTimesIn,in_RCX);
    iVar5 = iVar5 + 1;
  }
  __assert_fail("Abc_ObjFaninNum(pNode) <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                ,0x67,"void Sfm_TimNodeArrival(Sfm_Tim_t *, Abc_Obj_t *)");
}

Assistant:

int Sfm_TimTrace( Sfm_Tim_t * p )
{
    Abc_Obj_t * pObj; int i, Delay = 0;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( p->pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeArrival( p, pObj );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Delay = Abc_MaxInt( Delay, Sfm_TimArrMax(p, Abc_ObjFanin0(pObj)) );
    Vec_IntFill( &p->vTimReqs, 2*Abc_NtkObjNumMax(p->pNtk), ABC_INFINITY );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        Sfm_TimSetReq( p, Abc_ObjFanin0(pObj), Delay );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        Sfm_TimNodeRequired( p, pObj );
    Vec_PtrFree( vNodes );
    return Delay;
}